

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::test_run_start(XmlReporter *this)

{
  ScopedElement *__s;
  string *name;
  long in_RDI;
  string binary_name;
  string *in_stack_fffffffffffffcb8;
  XmlWriter *in_stack_fffffffffffffcc0;
  ScopedElement *this_00;
  string *in_stack_fffffffffffffcc8;
  ScopedElement *in_stack_fffffffffffffcd0;
  ScopedElement *this_01;
  string *in_stack_fffffffffffffce0;
  XmlWriter *in_stack_fffffffffffffce8;
  allocator<char> *in_stack_fffffffffffffcf0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  XmlWriter *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  XmlWriter *in_stack_fffffffffffffd50;
  undefined8 local_251;
  undefined8 local_229;
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  undefined1 local_1b1 [40];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [32];
  char *local_118;
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [47];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  String::c_str((String *)0x119b2c);
  skipPathFromFilename((char *)in_stack_fffffffffffffcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  XmlWriter::startElement(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  XmlWriter::writeAttribute
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x76) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  XmlWriter::scopedElement(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  local_118 = String::c_str((String *)0x119eb6);
  (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(char **)in_stack_fffffffffffffcc0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  XmlWriter::ScopedElement::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(uint *)in_stack_fffffffffffffcc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  XmlWriter::ScopedElement::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(uint *)in_stack_fffffffffffffcc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  XmlWriter::ScopedElement::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(uint *)in_stack_fffffffffffffcc0);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  __s = XmlWriter::ScopedElement::writeAttribute<int>
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                   (int *)in_stack_fffffffffffffcc0);
  __a = &local_1d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  XmlWriter::ScopedElement::writeAttribute<int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(int *)in_stack_fffffffffffffcc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  XmlWriter::ScopedElement::writeAttribute<bool>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
             &in_stack_fffffffffffffcc0->m_tagIsOpen);
  this_01 = (ScopedElement *)&local_229;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  name = (string *)
         XmlWriter::ScopedElement::writeAttribute<bool>
                   (this_01,in_stack_fffffffffffffcc8,&in_stack_fffffffffffffcc0->m_tagIsOpen);
  this_00 = (ScopedElement *)&local_251;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  XmlWriter::ScopedElement::writeAttribute<bool>(this_01,name,(bool *)this_00);
  std::__cxx11::string::~string((string *)((long)&local_251 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)((long)&local_229 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string((string *)(local_1b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  XmlWriter::ScopedElement::~ScopedElement(this_00);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void test_run_start() override {
            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS

            xml.startElement("doctest").writeAttribute("binary", binary_name);
            if(opt.no_version == false)
                xml.writeAttribute("version", DOCTEST_VERSION_STR);

            // only the consequential ones (TODO: filters)
            xml.scopedElement("Options")
                    .writeAttribute("order_by", opt.order_by.c_str())
                    .writeAttribute("rand_seed", opt.rand_seed)
                    .writeAttribute("first", opt.first)
                    .writeAttribute("last", opt.last)
                    .writeAttribute("abort_after", opt.abort_after)
                    .writeAttribute("subcase_filter_levels", opt.subcase_filter_levels)
                    .writeAttribute("case_sensitive", opt.case_sensitive)
                    .writeAttribute("no_throw", opt.no_throw)
                    .writeAttribute("no_skip", opt.no_skip);
        }